

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O0

void __thiscall
Js::JavascriptPromiseCapability::JavascriptPromiseCapability
          (JavascriptPromiseCapability *this,Var promise,Var resolve,Var reject)

{
  Var reject_local;
  Var resolve_local;
  Var promise_local;
  JavascriptPromiseCapability *this_local;
  
  FinalizableObject::FinalizableObject(&this->super_FinalizableObject);
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01e3b7c8;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->promise,promise);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->resolve,resolve);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->reject,reject);
  return;
}

Assistant:

JavascriptPromiseCapability(Var promise, Var resolve, Var reject)
            : promise(promise), resolve(resolve), reject(reject)
        { }